

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O1

aiMesh * __thiscall
Assimp::ColladaLoader::CreateMesh
          (ColladaLoader *this,ColladaParser *pParser,Mesh *pSrcMesh,SubMesh *pSubMesh,
          Controller *pSrcController,size_t pStartVertex,size_t pStartFace)

{
  AccessorLibrary *pLibrary;
  DataLibrary *pLibrary_00;
  map<Assimp::BaseImporter::ImporterUnits,_double,_std::less<Assimp::BaseImporter::ImporterUnits>,_std::allocator<std::pair<const_Assimp::BaseImporter::ImporterUnits,_double>_>_>
  *pmVar1;
  _Rb_tree_header *p_Var2;
  pointer *pppaVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  int iVar29;
  pointer paVar30;
  Mesh *pSrcMesh_00;
  SubMesh *pSubMesh_00;
  iterator __position;
  aiMesh *mesh;
  pointer pbVar31;
  pointer puVar32;
  unsigned_long uVar33;
  size_t sVar34;
  iterator __position_00;
  void *__src;
  bool bVar35;
  undefined1 auVar36 [16];
  undefined8 uVar37;
  aiVertexWeight aVar38;
  int iVar39;
  aiMesh *paVar40;
  aiVector3D *paVar41;
  aiColor4D *paVar42;
  ulong *puVar43;
  aiFace *paVar44;
  uint *puVar45;
  Mesh **ppMVar46;
  Accessor *pAVar47;
  Accessor *pAVar48;
  Data *pDVar49;
  Data *pDVar50;
  pointer pbVar51;
  pointer pfVar52;
  _Rb_tree_node_base *p_Var53;
  aiMesh *paVar54;
  aiAnimMesh **ppaVar55;
  Accessor *pAVar56;
  pointer ppVar57;
  aiBone **ppaVar58;
  aiBone *paVar59;
  char *__s;
  string *psVar60;
  aiVertexWeight *__s_00;
  Node *pNVar61;
  Logger *this_00;
  runtime_error *prVar62;
  aiFace *paVar63;
  long lVar64;
  long lVar65;
  size_t sVar66;
  uint uVar67;
  ulong uVar68;
  ulong uVar69;
  long lVar70;
  ulong uVar71;
  ColladaLoader *pCVar72;
  size_t *psVar73;
  size_t real;
  unsigned_long uVar74;
  uint uVar75;
  float fVar76;
  ai_real aVar77;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> targetMeshes;
  vector<float,_std::allocator<float>_> targetWeights;
  aiMesh *aimesh;
  vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
  dstBones;
  vector<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>
  weightStartPerVertex;
  vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_> animMeshes;
  int local_2e0;
  aiMesh **local_298;
  iterator iStack_290;
  aiMesh **local_288;
  Data *local_280;
  aiVector3D *local_278;
  float local_270;
  float local_26c;
  float local_268;
  float local_264;
  float local_260;
  float local_25c;
  float local_258;
  float local_254;
  float local_250;
  float local_24c;
  void *local_248;
  iterator iStack_240;
  float *local_238;
  aiMesh *local_228 [2];
  undefined1 local_218 [48];
  aiColor4D *local_1e8;
  Accessor *local_1d8;
  Accessor *local_1d0;
  aiColor4D *local_1c8;
  aiColor4D *paStack_1c0;
  aiColor4D *local_1b8;
  undefined1 local_1a8 [8];
  aiVertexWeight aStack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  paVar40 = (aiMesh *)operator_new(0x520);
  paVar40->mPrimitiveTypes = 0;
  paVar40->mNumVertices = 0;
  paVar40->mNumFaces = 0;
  memset(&paVar40->mVertices,0,0xcc);
  paVar40->mBones = (aiBone **)0x0;
  paVar40->mMaterialIndex = 0;
  (paVar40->mName).length = 0;
  (paVar40->mName).data[0] = '\0';
  memset((paVar40->mName).data + 1,0x1b,0x3ff);
  paVar40->mNumAnimMeshes = 0;
  paVar40->mAnimMeshes = (aiAnimMesh **)0x0;
  paVar40->mMethod = 0;
  (paVar40->mAABB).mMin.x = 0.0;
  (paVar40->mAABB).mMin.y = 0.0;
  (paVar40->mAABB).mMin.z = 0.0;
  (paVar40->mAABB).mMax.x = 0.0;
  (paVar40->mAABB).mMax.y = 0.0;
  (paVar40->mAABB).mMax.z = 0.0;
  paVar40->mTextureCoords[0] = (aiVector3D *)0x0;
  paVar40->mTextureCoords[1] = (aiVector3D *)0x0;
  paVar40->mTextureCoords[2] = (aiVector3D *)0x0;
  paVar40->mTextureCoords[3] = (aiVector3D *)0x0;
  paVar40->mTextureCoords[4] = (aiVector3D *)0x0;
  paVar40->mTextureCoords[5] = (aiVector3D *)0x0;
  paVar40->mTextureCoords[6] = (aiVector3D *)0x0;
  paVar40->mTextureCoords[7] = (aiVector3D *)0x0;
  paVar40->mNumUVComponents[0] = 0;
  paVar40->mNumUVComponents[1] = 0;
  paVar40->mNumUVComponents[2] = 0;
  paVar40->mNumUVComponents[3] = 0;
  paVar40->mNumUVComponents[4] = 0;
  paVar40->mNumUVComponents[5] = 0;
  paVar40->mNumUVComponents[6] = 0;
  paVar40->mNumUVComponents[7] = 0;
  paVar40->mColors[0] = (aiColor4D *)0x0;
  paVar40->mColors[1] = (aiColor4D *)0x0;
  paVar40->mColors[2] = (aiColor4D *)0x0;
  paVar40->mColors[3] = (aiColor4D *)0x0;
  paVar40->mColors[4] = (aiColor4D *)0x0;
  paVar40->mColors[5] = (aiColor4D *)0x0;
  paVar40->mColors[6] = (aiColor4D *)0x0;
  paVar40->mColors[7] = (aiColor4D *)0x0;
  uVar69 = (pSrcMesh->mName)._M_string_length;
  if (uVar69 < 0x400) {
    (paVar40->mName).length = (ai_uint32)uVar69;
    memcpy((paVar40->mName).data,(pSrcMesh->mName)._M_dataplus._M_p,uVar69);
    (paVar40->mName).data[uVar69] = '\0';
  }
  if (pSubMesh->mNumFaces == 0) {
    uVar69 = 0;
  }
  else {
    lVar64 = 0;
    uVar69 = 0;
    do {
      uVar69 = uVar69 + *(long *)((long)(pSrcMesh->mFaceSize).
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                 lVar64 + pStartFace * 8);
      lVar64 = lVar64 + 8;
    } while (pSubMesh->mNumFaces << 3 != lVar64);
  }
  paVar40->mNumVertices = (uint)uVar69;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar69;
  uVar68 = 0xffffffffffffffff;
  if (SUB168(auVar36 * ZEXT816(0xc),8) == 0) {
    uVar68 = SUB168(auVar36 * ZEXT816(0xc),0);
  }
  paVar41 = (aiVector3D *)operator_new__(uVar68);
  if (uVar69 != 0) {
    memset(paVar41,0,((uVar69 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
  }
  paVar40->mVertices = paVar41;
  if (uVar69 != 0) {
    memmove(paVar41,(pSrcMesh->mPositions).
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start + pStartVertex,uVar69 * 0xc);
  }
  paVar30 = (pSrcMesh->mNormals).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar4 = pStartVertex + uVar69;
  if (uVar4 <= (ulong)(((long)(pSrcMesh->mNormals).
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)paVar30 >> 2) *
                      -0x5555555555555555)) {
    paVar41 = (aiVector3D *)operator_new__(uVar68);
    if (uVar69 != 0) {
      memset(paVar41,0,((uVar69 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar40->mNormals = paVar41;
    if (uVar69 != 0) {
      memmove(paVar41,paVar30 + pStartVertex,uVar69 * 0xc);
    }
  }
  if (uVar4 <= (ulong)(((long)(pSrcMesh->mTangents).
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pSrcMesh->mTangents).
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555)
     ) {
    paVar41 = (aiVector3D *)operator_new__(uVar68);
    if (uVar69 != 0) {
      memset(paVar41,0,((uVar69 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar40->mTangents = paVar41;
    if (uVar69 != 0) {
      memmove(paVar41,(pSrcMesh->mTangents).
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start + pStartVertex,uVar69 * 0xc);
    }
  }
  if (uVar4 <= (ulong)(((long)(pSrcMesh->mBitangents).
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pSrcMesh->mBitangents).
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555)
     ) {
    paVar41 = (aiVector3D *)operator_new__(uVar68);
    if (uVar69 != 0) {
      memset(paVar41,0,((uVar69 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar40->mBitangents = paVar41;
    if (uVar69 != 0) {
      memmove(paVar41,(pSrcMesh->mBitangents).
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start + pStartVertex,uVar69 * 0xc);
    }
  }
  lVar70 = 0;
  lVar64 = 0;
  do {
    if (uVar4 <= (ulong)(((long)pSrcMesh->mTexCoords[lVar70].
                                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)pSrcMesh->mTexCoords[lVar70].
                                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 2) *
                        -0x5555555555555555)) {
      paVar41 = (aiVector3D *)operator_new__(uVar68);
      if (uVar69 != 0) {
        memset(paVar41,0,((uVar69 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      }
      paVar40->mTextureCoords[lVar64] = paVar41;
      if (uVar69 != 0) {
        lVar65 = 0;
        uVar71 = uVar69;
        do {
          paVar30 = pSrcMesh->mTexCoords[lVar70].
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          paVar41 = paVar40->mTextureCoords[lVar64];
          *(undefined4 *)((long)&paVar41->z + lVar65) =
               *(undefined4 *)((long)(paVar30 + pStartVertex) + 8U + lVar65);
          *(undefined8 *)((long)&paVar41->x + lVar65) =
               *(undefined8 *)((long)(paVar30 + pStartVertex) + lVar65);
          lVar65 = lVar65 + 0xc;
          uVar71 = uVar71 - 1;
        } while (uVar71 != 0);
      }
      paVar40->mNumUVComponents[lVar64] = pSrcMesh->mNumUVComponents[lVar70];
      lVar64 = lVar64 + 1;
    }
    lVar70 = lVar70 + 1;
  } while (lVar70 != 8);
  uVar68 = uVar69 << 4;
  lVar70 = 0;
  lVar64 = 0x178;
  do {
    if (uVar4 <= (ulong)(*(long *)((long)&(pSrcMesh->mName)._M_string_length + lVar64) -
                         *(long *)((long)&(pSrcMesh->mName)._M_dataplus._M_p + lVar64) >> 4)) {
      paVar42 = (aiColor4D *)operator_new__(-(ulong)(uVar69 >> 0x3c != 0) | uVar68);
      if (uVar69 != 0) {
        memset(paVar42,0,uVar68);
      }
      paVar40->mColors[lVar70] = paVar42;
      if (uVar69 != 0) {
        memmove(paVar40->mColors[lVar70],
                (void *)(*(long *)((long)&(pSrcMesh->mName)._M_dataplus._M_p + lVar64) +
                        pStartVertex * 0x10),uVar68);
      }
      lVar70 = lVar70 + 1;
    }
    lVar64 = lVar64 + 0x18;
  } while (lVar64 != 0x238);
  uVar67 = (uint)pSubMesh->mNumFaces;
  uVar69 = pSubMesh->mNumFaces & 0xffffffff;
  paVar40->mNumFaces = uVar67;
  puVar43 = (ulong *)operator_new__(uVar69 * 0x10 + 8);
  *puVar43 = uVar69;
  paVar44 = (aiFace *)(puVar43 + 1);
  if (uVar67 != 0) {
    paVar63 = paVar44;
    do {
      paVar63->mNumIndices = 0;
      paVar63->mIndices = (uint *)0x0;
      paVar63 = paVar63 + 1;
    } while (paVar63 != paVar44 + uVar69);
  }
  paVar40->mFaces = paVar44;
  if (paVar40->mNumFaces != 0) {
    uVar67 = 0;
    uVar69 = 0;
    do {
      uVar68 = (pSrcMesh->mFaceSize).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar69 + pStartFace];
      paVar44 = paVar40->mFaces;
      paVar44[uVar69].mNumIndices = (uint)uVar68;
      puVar45 = (uint *)operator_new__(-(ulong)(uVar68 >> 0x3e != 0) | uVar68 * 4);
      paVar44[uVar69].mIndices = puVar45;
      if (uVar68 != 0) {
        uVar71 = 0;
        uVar75 = uVar67;
        do {
          uVar67 = uVar75 + 1;
          paVar44[uVar69].mIndices[uVar71] = uVar75;
          uVar71 = uVar71 + 1;
          uVar75 = uVar67;
        } while (uVar68 != uVar71);
      }
      uVar69 = uVar69 + 1;
    } while (uVar69 < paVar40->mNumFaces);
  }
  local_298 = (aiMesh **)0x0;
  iStack_290._M_current = (aiMesh **)0x0;
  local_288 = (aiMesh **)0x0;
  local_238 = (float *)0x0;
  local_248 = (void *)0x0;
  iStack_240._M_current = (float *)0x0;
  p_Var53 = (pParser->mControllerLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(pParser->mControllerLibrary)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var53 == p_Var2) {
    uVar67 = 2;
  }
  else {
    iVar29 = 0;
    do {
      ppMVar46 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Mesh*>
                           (pParser,&pParser->mMeshLibrary,(string *)&p_Var53[2]._M_parent);
      if (p_Var53[2]._M_color == _S_black) {
        sVar66 = ((*ppMVar46)->mName)._M_string_length;
        if ((sVar66 == (pSrcMesh->mName)._M_string_length) &&
           ((sVar66 == 0 ||
            (iVar39 = bcmp(((*ppMVar46)->mName)._M_dataplus._M_p,(pSrcMesh->mName)._M_dataplus._M_p,
                           sVar66), iVar39 == 0)))) {
          pAVar47 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                              (pParser,&pParser->mAccessorLibrary,(string *)&p_Var53[0xc]._M_right);
          pAVar48 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                              (pParser,&pParser->mAccessorLibrary,(string *)&p_Var53[0xd]._M_right);
          pDVar49 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                              (pParser,&pParser->mDataLibrary,&pAVar47->mSource);
          pDVar50 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                              (pParser,&pParser->mDataLibrary,&pAVar48->mSource);
          if (pDVar49->mIsStringArray == false) {
            prVar62 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_1a8 = (undefined1  [8])local_198;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,"target data must contain id. ","");
            std::runtime_error::runtime_error(prVar62,(string *)local_1a8);
            *(undefined ***)prVar62 = &PTR__runtime_error_00900168;
            __cxa_throw(prVar62,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          if (pDVar50->mIsStringArray != false) {
            prVar62 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_1a8 = (undefined1  [8])local_198;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,"target weight data must not be textual ","");
            std::runtime_error::runtime_error(prVar62,(string *)local_1a8);
            *(undefined ***)prVar62 = &PTR__runtime_error_00900168;
            __cxa_throw(prVar62,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          iVar29 = *(int *)&p_Var53[2].field_0x4;
          pbVar51 = (pDVar49->mStrings).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((pDVar49->mStrings).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish != pbVar51) {
            uVar69 = 0;
            uVar68 = 1;
            do {
              ppMVar46 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Mesh*>
                                   (pParser,&pParser->mMeshLibrary,pbVar51 + uVar69);
              pSrcMesh_00 = *ppMVar46;
              local_228[0] = findMesh(this,&pSrcMesh_00->mName);
              if (local_228[0] == (aiMesh *)0x0) {
                pSubMesh_00 = (pSrcMesh_00->mSubMeshes).
                              super__Vector_base<Assimp::Collada::SubMesh,_std::allocator<Assimp::Collada::SubMesh>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                lVar64 = (long)(pSrcMesh_00->mSubMeshes).
                               super__Vector_base<Assimp::Collada::SubMesh,_std::allocator<Assimp::Collada::SubMesh>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pSubMesh_00;
                if (1 < (ulong)((lVar64 >> 3) * -0x3333333333333333)) {
                  prVar62 = (runtime_error *)__cxa_allocate_exception(0x10);
                  local_1a8 = (undefined1  [8])local_198;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1a8,"Morhing target mesh must be a single","");
                  std::runtime_error::runtime_error(prVar62,(string *)local_1a8);
                  *(undefined ***)prVar62 = &PTR__runtime_error_00900168;
                  __cxa_throw(prVar62,&DeadlyImportError::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                if (lVar64 != 0x28) {
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,0);
                }
                local_228[0] = CreateMesh(this,pParser,pSrcMesh_00,pSubMesh_00,(Controller *)0x0,0,0
                                         );
                __position._M_current =
                     (this->mTargetMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (this->mTargetMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                            ((vector<aiMesh*,std::allocator<aiMesh*>> *)&this->mTargetMeshes,
                             __position,local_228);
                }
                else {
                  *__position._M_current = local_228[0];
                  pppaVar3 = &(this->mTargetMeshes).
                              super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                              super__Vector_impl_data._M_finish;
                  *pppaVar3 = *pppaVar3 + 1;
                }
              }
              if (iStack_290._M_current == local_288) {
                std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                          ((vector<aiMesh*,std::allocator<aiMesh*>> *)&local_298,iStack_290,
                           local_228);
              }
              else {
                *iStack_290._M_current = local_228[0];
                iStack_290._M_current = iStack_290._M_current + 1;
              }
              pbVar51 = (pDVar49->mStrings).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              bVar35 = uVar68 < (ulong)((long)(pDVar49->mStrings).
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)pbVar51 >> 5);
              uVar69 = uVar68;
              uVar68 = (ulong)((int)uVar68 + 1);
            } while (bVar35);
          }
          pfVar52 = (pDVar50->mValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if ((pDVar50->mValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish != pfVar52) {
            uVar69 = 0;
            uVar68 = 1;
            do {
              if (iStack_240._M_current == local_238) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)&local_248,iStack_240,
                           pfVar52 + uVar69);
              }
              else {
                *iStack_240._M_current = pfVar52[uVar69];
                iStack_240._M_current = iStack_240._M_current + 1;
              }
              pfVar52 = (pDVar50->mValues).super__Vector_base<float,_std::allocator<float>_>._M_impl
                        .super__Vector_impl_data._M_start;
              bVar35 = uVar68 < (ulong)((long)(pDVar50->mValues).
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_finish -
                                        (long)pfVar52 >> 2);
              uVar69 = uVar68;
              uVar68 = (ulong)((int)uVar68 + 1);
            } while (bVar35);
          }
        }
      }
      p_Var53 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var53);
    } while ((_Rb_tree_header *)p_Var53 != p_Var2);
    uVar67 = iVar29 == 1 | 2;
  }
  if (((long)iStack_290._M_current - (long)local_298 != 0) &&
     ((long)iStack_240._M_current - (long)local_248 >> 2 ==
      (long)iStack_290._M_current - (long)local_298 >> 3)) {
    local_1a8._0_4_ = 0;
    local_1a8._4_4_ = 0.0;
    aStack_1a0.mVertexId = 0;
    aStack_1a0.mWeight = 0.0;
    local_198[0]._0_4_ = 0;
    local_198[0]._4_4_ = 0.0;
    if (iStack_290._M_current != local_298) {
      uVar69 = 0;
      uVar68 = 1;
      do {
        mesh = local_298[uVar69];
        paVar54 = (aiMesh *)aiCreateAnimMesh(mesh);
        fVar76 = *(float *)((long)local_248 + uVar69 * 4);
        uVar75 = -(uint)(fVar76 == 0.0);
        *(uint *)((paVar54->mName).data + 0x3bc) = uVar75 & 0x3f800000 | ~uVar75 & (uint)fVar76;
        local_228[0] = paVar54;
        if (paVar54 != (aiMesh *)&mesh->mName) {
          uVar75 = (mesh->mName).length;
          paVar54->mPrimitiveTypes = uVar75;
          memcpy(&paVar54->mNumVertices,(mesh->mName).data,(ulong)uVar75);
          *(undefined1 *)((long)paVar54->mColors + ((ulong)uVar75 - 0x2c)) = 0;
        }
        if (aStack_1a0 == (aiVertexWeight)local_198[0]._0_8_) {
          std::vector<aiAnimMesh*,std::allocator<aiAnimMesh*>>::_M_realloc_insert<aiAnimMesh*const&>
                    ((vector<aiAnimMesh*,std::allocator<aiAnimMesh*>> *)local_1a8,
                     (iterator)aStack_1a0,(aiAnimMesh **)local_228);
        }
        else {
          *(aiMesh **)aStack_1a0 = local_228[0];
          aStack_1a0 = (aiVertexWeight)((long)aStack_1a0 + 8);
        }
        bVar35 = uVar68 < (ulong)((long)iStack_290._M_current - (long)local_298 >> 3);
        uVar69 = uVar68;
        uVar68 = (ulong)((int)uVar68 + 1);
      } while (bVar35);
    }
    paVar40->mMethod = uVar67;
    uVar69 = (long)aStack_1a0 - (long)local_1a8 >> 3;
    ppaVar55 = (aiAnimMesh **)
               operator_new__(-(ulong)(uVar69 >> 0x3d != 0) | (long)aStack_1a0 - (long)local_1a8);
    paVar40->mAnimMeshes = ppaVar55;
    paVar40->mNumAnimMeshes = (uint)uVar69;
    if (aStack_1a0 != (aiVertexWeight)local_1a8) {
      uVar67 = 1;
      uVar69 = 0;
      do {
        paVar40->mAnimMeshes[uVar69] = *(aiAnimMesh **)((long)local_1a8 + uVar69 * 8);
        uVar69 = (ulong)uVar67;
        uVar67 = uVar67 + 1;
      } while (uVar69 < (ulong)((long)aStack_1a0 - (long)local_1a8 >> 3));
    }
    if ((aiVertexWeight)local_1a8 != (aiVertexWeight)0x0) {
      operator_delete((void *)local_1a8);
    }
  }
  if ((pSrcController != (Controller *)0x0) && (pSrcController->mType == Skin)) {
    pLibrary = &pParser->mAccessorLibrary;
    pAVar47 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                        (pParser,pLibrary,&pSrcController->mJointNameSource);
    pLibrary_00 = &pParser->mDataLibrary;
    local_280 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                          (pParser,pLibrary_00,&pAVar47->mSource);
    pAVar48 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                        (pParser,pLibrary,&pSrcController->mJointOffsetMatrixSource);
    local_218._16_8_ =
         ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                   (pParser,pLibrary_00,&pAVar48->mSource);
    pAVar56 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                        (pParser,pLibrary,&(pSrcController->mWeightInputJoints).mAccessor);
    if (pAVar56 != pAVar47) {
      prVar62 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_1a8 = (undefined1  [8])local_198;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,
                 "Temporary implementational laziness. If you read this, please report to the author."
                 ,"");
      std::runtime_error::runtime_error(prVar62,(string *)local_1a8);
      *(undefined ***)prVar62 = &PTR__runtime_error_00900168;
      __cxa_throw(prVar62,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    pAVar56 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                        (pParser,pLibrary,&(pSrcController->mWeightInputWeights).mAccessor);
    pDVar49 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                        (pParser,pLibrary_00,&pAVar56->mSource);
    if (((local_280->mIsStringArray != true) || (*(bool *)local_218._16_8_ != false)) ||
       (pDVar49->mIsStringArray == true)) {
      prVar62 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_1a8 = (undefined1  [8])local_198;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"Data type mismatch while resolving mesh joints","");
      std::runtime_error::runtime_error(prVar62,(string *)local_1a8);
      *(undefined ***)prVar62 = &PTR__runtime_error_00900168;
      __cxa_throw(prVar62,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if (((pSrcController->mWeightInputJoints).mOffset != 0) ||
       ((pSrcController->mWeightInputWeights).mOffset != 1)) {
      prVar62 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_1a8 = (undefined1  [8])local_198;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"Unsupported vertex_weight addressing scheme. ","");
      std::runtime_error::runtime_error(prVar62,(string *)local_1a8);
      *(undefined ***)prVar62 = &PTR__runtime_error_00900168;
      __cxa_throw(prVar62,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    pbVar51 = (local_280->mStrings).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar31 = (local_280->mStrings).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_278 = (aiVector3D *)((long)pbVar31 - (long)pbVar51 >> 5);
    std::
    vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
    ::vector((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
              *)(local_218 + 0x28),(size_type)local_278,(allocator_type *)local_1a8);
    pCVar72 = (ColladaLoader *)&local_1c8;
    local_1c8 = (aiColor4D *)0x0;
    paStack_1c0 = (aiColor4D *)0x0;
    local_1b8 = (aiColor4D *)0x0;
    local_1a8 = (undefined1  [8])
                (pSrcController->mWeights).
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    std::
    vector<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>
    ::resize((vector<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>
              *)pCVar72,
             (long)(pSrcController->mWeightCounts).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pSrcController->mWeightCounts).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,(value_type *)local_1a8);
    if ((pSrcController->mWeightCounts).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (pSrcController->mWeightCounts).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      ppVar57 = (pSrcController->mWeights).
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar69 = 0;
      do {
        *(pointer *)(&local_1c8->r + uVar69 * 2) = ppVar57;
        puVar32 = (pSrcController->mWeightCounts).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pCVar72 = (ColladaLoader *)(puVar32[uVar69] * 0x10);
        ppVar57 = (pointer)((long)&ppVar57->first +
                           (long)&(pCVar72->super_BaseImporter)._vptr_BaseImporter);
        uVar69 = uVar69 + 1;
      } while (uVar69 < (ulong)((long)(pSrcController->mWeightCounts).
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar32 >>
                               3));
    }
    uVar69 = pStartVertex;
    local_1d8 = pAVar48;
    local_1d0 = pAVar47;
    if (pStartVertex < uVar4) {
      do {
        uVar33 = (pSrcMesh->mFacePosIndices).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar69];
        uVar74 = (pSrcController->mWeightCounts).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar33];
        if (uVar74 != 0) {
          local_2e0 = (int)pStartVertex;
          uVar67 = (int)uVar69 - local_2e0;
          psVar73 = (size_t *)(*(long *)(&local_1c8->r + uVar33 * 2) + 8);
          do {
            sVar34 = psVar73[-1];
            fVar76 = 1.0;
            if ((pDVar49->mValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start !=
                (pDVar49->mValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              fVar76 = ReadFloat(pCVar72,pAVar56,pDVar49,*psVar73,0);
            }
            if (0.0 < fVar76) {
              local_1a8._4_4_ = fVar76;
              local_1a8._0_4_ = uVar67;
              pCVar72 = (ColladaLoader *)(local_218._40_8_ + sVar34 * 0x18);
              __position_00._M_current =
                   *(aiVertexWeight **)&(pCVar72->super_BaseImporter).importerUnits._M_t._M_impl;
              if (__position_00._M_current ==
                  *(aiVertexWeight **)
                   &(pCVar72->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header.
                    _M_header) {
                std::vector<aiVertexWeight,std::allocator<aiVertexWeight>>::
                _M_realloc_insert<aiVertexWeight_const&>
                          ((vector<aiVertexWeight,std::allocator<aiVertexWeight>> *)pCVar72,
                           __position_00,(aiVertexWeight *)local_1a8);
              }
              else {
                (__position_00._M_current)->mVertexId = uVar67;
                (__position_00._M_current)->mWeight = fVar76;
                pmVar1 = &(pCVar72->super_BaseImporter).importerUnits;
                *(long *)&(pmVar1->_M_t)._M_impl = *(long *)&(pmVar1->_M_t)._M_impl + 8;
              }
            }
            psVar73 = psVar73 + 2;
            uVar74 = uVar74 - 1;
          } while (uVar74 != 0);
        }
        uVar69 = uVar69 + 1;
      } while (uVar69 != uVar4);
    }
    uVar69 = 0;
    for (paVar42 = (aiColor4D *)local_218._40_8_; paVar42 != local_1e8;
        paVar42 = (aiColor4D *)&paVar42[1].b) {
      lVar64._0_4_ = paVar42->r;
      lVar64._4_4_ = paVar42->g;
      uVar69 = uVar69 + (*(long *)&paVar42->b != lVar64);
    }
    paVar40->mNumBones = (uint)uVar69;
    ppaVar58 = (aiBone **)operator_new__(-(ulong)(uVar69 >> 0x3d != 0) | uVar69 << 3);
    paVar40->mBones = ppaVar58;
    if (pbVar31 != pbVar51) {
      local_278 = (aiVector3D *)((long)&local_278->x + (ulong)(local_278 == (aiVector3D *)0x0));
      lVar64 = 8;
      paVar41 = (aiVector3D *)0x0;
      local_218._32_8_ = (aiVector3D *)0x0;
      do {
        if (*(long *)(local_218._40_8_ + lVar64 + -8) !=
            *(long *)((long)(float *)local_218._40_8_ + lVar64)) {
          paVar59 = (aiBone *)operator_new(0x450);
          (paVar59->mName).length = 0;
          __s = (paVar59->mName).data;
          (paVar59->mName).data[0] = '\0';
          pCVar72 = (ColladaLoader *)((paVar59->mName).data + 1);
          memset(pCVar72,0x1b,0x3ff);
          paVar59->mNumWeights = 0;
          paVar59->mWeights = (aiVertexWeight *)0x0;
          (paVar59->mOffsetMatrix).a1 = 1.0;
          (paVar59->mOffsetMatrix).a2 = 0.0;
          (paVar59->mOffsetMatrix).a3 = 0.0;
          (paVar59->mOffsetMatrix).a4 = 0.0;
          (paVar59->mOffsetMatrix).b1 = 0.0;
          (paVar59->mOffsetMatrix).b2 = 1.0;
          (paVar59->mOffsetMatrix).b3 = 0.0;
          (paVar59->mOffsetMatrix).b4 = 0.0;
          (paVar59->mOffsetMatrix).c1 = 0.0;
          (paVar59->mOffsetMatrix).c2 = 0.0;
          (paVar59->mOffsetMatrix).c3 = 1.0;
          (paVar59->mOffsetMatrix).c4 = 0.0;
          (paVar59->mOffsetMatrix).d1 = 0.0;
          (paVar59->mOffsetMatrix).d2 = 0.0;
          (paVar59->mOffsetMatrix).d3 = 0.0;
          (paVar59->mOffsetMatrix).d4 = 1.0;
          psVar60 = ReadString_abi_cxx11_(pCVar72,local_1d0,local_280,(size_t)paVar41);
          uVar69 = psVar60->_M_string_length;
          if (uVar69 < 0x400) {
            (paVar59->mName).length = (ai_uint32)uVar69;
            pCVar72 = (ColladaLoader *)__s;
            memcpy(__s,(psVar60->_M_dataplus)._M_p,uVar69);
            (paVar59->mName).data[uVar69] = '\0';
          }
          pAVar47 = local_1d8;
          uVar37 = local_218._16_8_;
          aVar77 = ReadFloat(pCVar72,local_1d8,(Data *)local_218._16_8_,(size_t)paVar41,0);
          (paVar59->mOffsetMatrix).a1 = aVar77;
          aVar77 = ReadFloat(pCVar72,pAVar47,(Data *)uVar37,(size_t)paVar41,1);
          (paVar59->mOffsetMatrix).a2 = aVar77;
          aVar77 = ReadFloat(pCVar72,pAVar47,(Data *)uVar37,(size_t)paVar41,2);
          (paVar59->mOffsetMatrix).a3 = aVar77;
          aVar77 = ReadFloat(pCVar72,pAVar47,(Data *)uVar37,(size_t)paVar41,3);
          (paVar59->mOffsetMatrix).a4 = aVar77;
          aVar77 = ReadFloat(pCVar72,pAVar47,(Data *)uVar37,(size_t)paVar41,4);
          (paVar59->mOffsetMatrix).b1 = aVar77;
          aVar77 = ReadFloat(pCVar72,pAVar47,(Data *)uVar37,(size_t)paVar41,5);
          (paVar59->mOffsetMatrix).b2 = aVar77;
          aVar77 = ReadFloat(pCVar72,pAVar47,(Data *)uVar37,(size_t)paVar41,6);
          (paVar59->mOffsetMatrix).b3 = aVar77;
          aVar77 = ReadFloat(pCVar72,pAVar47,(Data *)uVar37,(size_t)paVar41,7);
          (paVar59->mOffsetMatrix).b4 = aVar77;
          aVar77 = ReadFloat(pCVar72,pAVar47,(Data *)uVar37,(size_t)paVar41,8);
          (paVar59->mOffsetMatrix).c1 = aVar77;
          aVar77 = ReadFloat(pCVar72,pAVar47,(Data *)uVar37,(size_t)paVar41,9);
          (paVar59->mOffsetMatrix).c2 = aVar77;
          aVar77 = ReadFloat(pCVar72,pAVar47,(Data *)uVar37,(size_t)paVar41,10);
          (paVar59->mOffsetMatrix).c3 = aVar77;
          aVar77 = ReadFloat(pCVar72,pAVar47,(Data *)uVar37,(size_t)paVar41,0xb);
          uVar37 = local_218._40_8_;
          (paVar59->mOffsetMatrix).c4 = aVar77;
          uVar68 = *(long *)((long)(float *)local_218._40_8_ + lVar64) -
                   *(long *)(local_218._40_8_ + lVar64 + -8) >> 3;
          paVar59->mNumWeights = (uint)uVar68;
          uVar68 = uVar68 & 0xffffffff;
          uVar69 = uVar68 * 8;
          __s_00 = (aiVertexWeight *)operator_new__(uVar69);
          if (uVar68 != 0) {
            memset(__s_00,0,uVar69);
          }
          paVar59->mWeights = __s_00;
          __src = *(void **)(uVar37 + lVar64 + -8);
          sVar66 = *(long *)((long)(float *)uVar37 + lVar64) - (long)__src;
          local_218._24_8_ = paVar41;
          if (sVar66 != 0) {
            memmove(__s_00,__src,sVar66);
          }
          fVar76 = pSrcController->mBindShapeMatrix[0];
          fVar5 = pSrcController->mBindShapeMatrix[1];
          local_268 = pSrcController->mBindShapeMatrix[4];
          fVar6 = pSrcController->mBindShapeMatrix[5];
          fVar7 = pSrcController->mBindShapeMatrix[6];
          fVar8 = pSrcController->mBindShapeMatrix[8];
          fVar9 = pSrcController->mBindShapeMatrix[9];
          fVar10 = pSrcController->mBindShapeMatrix[0xc];
          fVar11 = pSrcController->mBindShapeMatrix[0xd];
          fVar12 = (paVar59->mOffsetMatrix).a1;
          fVar13 = (paVar59->mOffsetMatrix).a2;
          fVar14 = (paVar59->mOffsetMatrix).a3;
          fVar15 = (paVar59->mOffsetMatrix).a4;
          local_24c = fVar10 * fVar15 + fVar8 * fVar14 + fVar76 * fVar12 + local_268 * fVar13;
          local_250 = fVar11 * fVar15 + fVar9 * fVar14 + fVar5 * fVar12 + fVar6 * fVar13;
          local_26c = pSrcController->mBindShapeMatrix[2];
          fVar16 = pSrcController->mBindShapeMatrix[10];
          fVar17 = pSrcController->mBindShapeMatrix[0xe];
          local_254 = fVar17 * fVar15 + fVar16 * fVar14 + local_26c * fVar12 + fVar7 * fVar13;
          local_270 = pSrcController->mBindShapeMatrix[7];
          fVar18 = pSrcController->mBindShapeMatrix[3];
          fVar19 = pSrcController->mBindShapeMatrix[0xb];
          fVar20 = pSrcController->mBindShapeMatrix[0xf];
          local_258 = fVar15 * fVar20 + fVar14 * fVar19 + fVar12 * fVar18 + fVar13 * local_270;
          fVar12 = (paVar59->mOffsetMatrix).b2;
          fVar13 = (paVar59->mOffsetMatrix).b1;
          fVar14 = (paVar59->mOffsetMatrix).b3;
          fVar15 = (paVar59->mOffsetMatrix).b4;
          local_25c = fVar10 * fVar15 + fVar8 * fVar14 + fVar76 * fVar13 + local_268 * fVar12;
          local_260 = fVar11 * fVar15 + fVar9 * fVar14 + fVar5 * fVar13 + fVar6 * fVar12;
          local_264 = fVar17 * fVar15 + fVar16 * fVar14 + local_26c * fVar13 + fVar7 * fVar12;
          fVar21 = (paVar59->mOffsetMatrix).c2;
          fVar22 = (paVar59->mOffsetMatrix).c1;
          fVar23 = (paVar59->mOffsetMatrix).c3;
          fVar24 = (paVar59->mOffsetMatrix).c4;
          fVar25 = (paVar59->mOffsetMatrix).d2;
          fVar26 = (paVar59->mOffsetMatrix).d1;
          fVar27 = (paVar59->mOffsetMatrix).d3;
          fVar28 = (paVar59->mOffsetMatrix).d4;
          (paVar59->mOffsetMatrix).a1 = local_24c;
          (paVar59->mOffsetMatrix).a2 = local_250;
          (paVar59->mOffsetMatrix).a3 = local_254;
          (paVar59->mOffsetMatrix).a4 = local_258;
          (paVar59->mOffsetMatrix).b1 = local_25c;
          (paVar59->mOffsetMatrix).b2 = local_260;
          (paVar59->mOffsetMatrix).b3 = local_264;
          (paVar59->mOffsetMatrix).b4 =
               fVar15 * fVar20 + fVar14 * fVar19 + fVar13 * fVar18 + fVar12 * local_270;
          (paVar59->mOffsetMatrix).c1 =
               fVar10 * fVar24 + fVar8 * fVar23 + fVar76 * fVar22 + local_268 * fVar21;
          (paVar59->mOffsetMatrix).c2 =
               fVar11 * fVar24 + fVar9 * fVar23 + fVar5 * fVar22 + fVar6 * fVar21;
          (paVar59->mOffsetMatrix).c3 =
               fVar17 * fVar24 + fVar16 * fVar23 + local_26c * fVar22 + fVar7 * fVar21;
          (paVar59->mOffsetMatrix).c4 =
               fVar24 * fVar20 + fVar23 * fVar19 + fVar22 * fVar18 + fVar21 * local_270;
          (paVar59->mOffsetMatrix).d1 =
               fVar10 * fVar28 + fVar8 * fVar27 + fVar76 * fVar26 + local_268 * fVar25;
          (paVar59->mOffsetMatrix).d2 =
               fVar11 * fVar28 + fVar9 * fVar27 + fVar5 * fVar26 + fVar6 * fVar25;
          (paVar59->mOffsetMatrix).d3 =
               fVar17 * fVar28 + fVar16 * fVar27 + local_26c * fVar26 + fVar7 * fVar25;
          (paVar59->mOffsetMatrix).d4 =
               fVar20 * fVar28 + fVar19 * fVar27 + fVar18 * fVar26 + local_270 * fVar25;
          pNVar61 = pParser->mRootNode;
          local_1a8 = (undefined1  [8])local_198;
          sVar66 = strlen(__s);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,__s,__s + sVar66);
          pNVar61 = FindNode(this,pNVar61,(string *)local_1a8);
          if (local_1a8 != (undefined1  [8])local_198) {
            operator_delete((void *)local_1a8);
          }
          if (pNVar61 == (Node *)0x0) {
            pNVar61 = pParser->mRootNode;
            local_1a8 = (undefined1  [8])local_198;
            sVar66 = strlen(__s);
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,__s,__s + sVar66);
            pNVar61 = FindNodeBySID(this,pNVar61,(string *)local_1a8);
            if (local_1a8 != (undefined1  [8])local_198) {
              operator_delete((void *)local_1a8);
            }
          }
          if (pNVar61 == (Node *)0x0) {
            this_00 = DefaultLogger::get();
            paVar41 = (aiVector3D *)local_218._24_8_;
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter<char[75]>
                      ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,
                       (char (*) [75])
                       "ColladaLoader::CreateMesh(): could not find corresponding node for joint \""
                      );
            sVar66 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar66);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\".",2);
            std::__cxx11::stringbuf::str();
            Logger::warn(this_00,(char *)local_228[0]);
            if (local_228[0] != (aiMesh *)local_218) {
              operator_delete(local_228[0]);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
          }
          else {
            FindNameForNode_abi_cxx11_((string *)local_1a8,this,pNVar61);
            aVar38 = aStack_1a0;
            paVar41 = (aiVector3D *)local_218._24_8_;
            if ((ulong)aStack_1a0 < 0x400) {
              (paVar59->mName).length = aStack_1a0.mVertexId;
              memcpy(__s,(void *)local_1a8,(size_t)aStack_1a0);
              (paVar59->mName).data[(long)aVar38] = '\0';
            }
            if (local_1a8 != (undefined1  [8])local_198) {
              operator_delete((void *)local_1a8);
            }
          }
          paVar40->mBones[local_218._32_8_] = paVar59;
          local_218._32_8_ = (long)(float *)local_218._32_8_ + 1;
        }
        paVar41 = (aiVector3D *)((long)&paVar41->x + 1);
        lVar64 = lVar64 + 0x18;
      } while (local_278 != paVar41);
    }
    if (local_1c8 != (aiColor4D *)0x0) {
      operator_delete(local_1c8);
    }
    std::
    vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
    ::~vector((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
               *)(local_218 + 0x28));
  }
  if (local_248 != (void *)0x0) {
    operator_delete(local_248);
  }
  if (local_298 != (aiMesh **)0x0) {
    operator_delete(local_298);
  }
  return paVar40;
}

Assistant:

aiMesh* ColladaLoader::CreateMesh(const ColladaParser& pParser, const Collada::Mesh* pSrcMesh, const Collada::SubMesh& pSubMesh,
    const Collada::Controller* pSrcController, size_t pStartVertex, size_t pStartFace) {
    std::unique_ptr<aiMesh> dstMesh(new aiMesh);

    dstMesh->mName = pSrcMesh->mName;

    // count the vertices addressed by its faces
    const size_t numVertices = std::accumulate(pSrcMesh->mFaceSize.begin() + pStartFace,
        pSrcMesh->mFaceSize.begin() + pStartFace + pSubMesh.mNumFaces, size_t(0));

    // copy positions
    dstMesh->mNumVertices = static_cast<unsigned int>(numVertices);
    dstMesh->mVertices = new aiVector3D[numVertices];
    std::copy(pSrcMesh->mPositions.begin() + pStartVertex, pSrcMesh->mPositions.begin() +
        pStartVertex + numVertices, dstMesh->mVertices);

    // normals, if given. HACK: (thom) Due to the glorious Collada spec we never
    // know if we have the same number of normals as there are positions. So we
    // also ignore any vertex attribute if it has a different count
    if (pSrcMesh->mNormals.size() >= pStartVertex + numVertices) {
        dstMesh->mNormals = new aiVector3D[numVertices];
        std::copy(pSrcMesh->mNormals.begin() + pStartVertex, pSrcMesh->mNormals.begin() +
            pStartVertex + numVertices, dstMesh->mNormals);
    }

    // tangents, if given.
    if (pSrcMesh->mTangents.size() >= pStartVertex + numVertices) {
        dstMesh->mTangents = new aiVector3D[numVertices];
        std::copy(pSrcMesh->mTangents.begin() + pStartVertex, pSrcMesh->mTangents.begin() +
            pStartVertex + numVertices, dstMesh->mTangents);
    }

    // bitangents, if given.
    if (pSrcMesh->mBitangents.size() >= pStartVertex + numVertices) {
        dstMesh->mBitangents = new aiVector3D[numVertices];
        std::copy(pSrcMesh->mBitangents.begin() + pStartVertex, pSrcMesh->mBitangents.begin() +
            pStartVertex + numVertices, dstMesh->mBitangents);
    }

    // same for texturecoords, as many as we have
    // empty slots are not allowed, need to pack and adjust UV indexes accordingly
    for (size_t a = 0, real = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++a) {
        if (pSrcMesh->mTexCoords[a].size() >= pStartVertex + numVertices) {
            dstMesh->mTextureCoords[real] = new aiVector3D[numVertices];
            for (size_t b = 0; b < numVertices; ++b) {
                dstMesh->mTextureCoords[real][b] = pSrcMesh->mTexCoords[a][pStartVertex + b];
            }

            dstMesh->mNumUVComponents[real] = pSrcMesh->mNumUVComponents[a];
            ++real;
        }
    }

    // same for vertex colors, as many as we have. again the same packing to avoid empty slots
    for (size_t a = 0, real = 0; a < AI_MAX_NUMBER_OF_COLOR_SETS; ++a) {
        if (pSrcMesh->mColors[a].size() >= pStartVertex + numVertices) {
            dstMesh->mColors[real] = new aiColor4D[numVertices];
            std::copy(pSrcMesh->mColors[a].begin() + pStartVertex, pSrcMesh->mColors[a].begin() + pStartVertex + numVertices, dstMesh->mColors[real]);
            ++real;
        }
    }

    // create faces. Due to the fact that each face uses unique vertices, we can simply count up on each vertex
    size_t vertex = 0;
    dstMesh->mNumFaces = static_cast<unsigned int>(pSubMesh.mNumFaces);
    dstMesh->mFaces = new aiFace[dstMesh->mNumFaces];
    for (size_t a = 0; a < dstMesh->mNumFaces; ++a) {
        size_t s = pSrcMesh->mFaceSize[pStartFace + a];
        aiFace& face = dstMesh->mFaces[a];
        face.mNumIndices = static_cast<unsigned int>(s);
        face.mIndices = new unsigned int[s];
        for (size_t b = 0; b < s; ++b) {
            face.mIndices[b] = static_cast<unsigned int>(vertex++);
        }
    }

    // create morph target meshes if any
    std::vector<aiMesh*> targetMeshes;
    std::vector<float> targetWeights;
    Collada::MorphMethod method = Collada::Normalized;

    for (std::map<std::string, Collada::Controller>::const_iterator it = pParser.mControllerLibrary.begin();
        it != pParser.mControllerLibrary.end(); ++it) {
        const Collada::Controller &c = it->second;
        const Collada::Mesh* baseMesh = pParser.ResolveLibraryReference(pParser.mMeshLibrary, c.mMeshId);

        if (c.mType == Collada::Morph && baseMesh->mName == pSrcMesh->mName) {
            const Collada::Accessor& targetAccessor = pParser.ResolveLibraryReference(pParser.mAccessorLibrary, c.mMorphTarget);
            const Collada::Accessor& weightAccessor = pParser.ResolveLibraryReference(pParser.mAccessorLibrary, c.mMorphWeight);
            const Collada::Data& targetData = pParser.ResolveLibraryReference(pParser.mDataLibrary, targetAccessor.mSource);
            const Collada::Data& weightData = pParser.ResolveLibraryReference(pParser.mDataLibrary, weightAccessor.mSource);

            // take method
            method = c.mMethod;

            if (!targetData.mIsStringArray) {
                throw DeadlyImportError("target data must contain id. ");
            }
            if (weightData.mIsStringArray) {
                throw DeadlyImportError("target weight data must not be textual ");
            }

            for (unsigned int i = 0; i < targetData.mStrings.size(); ++i) {
                const Collada::Mesh* targetMesh = pParser.ResolveLibraryReference(pParser.mMeshLibrary, targetData.mStrings.at(i));

                aiMesh *aimesh = findMesh(targetMesh->mName);
                if (!aimesh) {
                    if (targetMesh->mSubMeshes.size() > 1) {
                        throw DeadlyImportError("Morhing target mesh must be a single");
                    }
                    aimesh = CreateMesh(pParser, targetMesh, targetMesh->mSubMeshes.at(0), NULL, 0, 0);
                    mTargetMeshes.push_back(aimesh);
                }
                targetMeshes.push_back(aimesh);
            }
            for (unsigned int i = 0; i < weightData.mValues.size(); ++i) {
                targetWeights.push_back(weightData.mValues.at(i));
            }
        }
    }
    if (targetMeshes.size() > 0 && targetWeights.size() == targetMeshes.size()) {
        std::vector<aiAnimMesh*> animMeshes;
        for (unsigned int i = 0; i < targetMeshes.size(); ++i) {
            aiMesh* targetMesh = targetMeshes.at(i);
            aiAnimMesh *animMesh = aiCreateAnimMesh(targetMesh);
            float weight = targetWeights[i];
            animMesh->mWeight = weight == 0 ? 1.0f : weight;
            animMesh->mName = targetMesh->mName;
            animMeshes.push_back(animMesh);
        }
        dstMesh->mMethod = (method == Collada::Relative)
            ? aiMorphingMethod_MORPH_RELATIVE
            : aiMorphingMethod_MORPH_NORMALIZED;
        dstMesh->mAnimMeshes = new aiAnimMesh*[animMeshes.size()];
        dstMesh->mNumAnimMeshes = static_cast<unsigned int>(animMeshes.size());
        for (unsigned int i = 0; i < animMeshes.size(); ++i) {
            dstMesh->mAnimMeshes[i] = animMeshes.at(i);
        }
    }

    // create bones if given
    if (pSrcController && pSrcController->mType == Collada::Skin) {
        // resolve references - joint names
        const Collada::Accessor& jointNamesAcc = pParser.ResolveLibraryReference(pParser.mAccessorLibrary, pSrcController->mJointNameSource);
        const Collada::Data& jointNames = pParser.ResolveLibraryReference(pParser.mDataLibrary, jointNamesAcc.mSource);
        // joint offset matrices
        const Collada::Accessor& jointMatrixAcc = pParser.ResolveLibraryReference(pParser.mAccessorLibrary, pSrcController->mJointOffsetMatrixSource);
        const Collada::Data& jointMatrices = pParser.ResolveLibraryReference(pParser.mDataLibrary, jointMatrixAcc.mSource);
        // joint vertex_weight name list - should refer to the same list as the joint names above. If not, report and reconsider
        const Collada::Accessor& weightNamesAcc = pParser.ResolveLibraryReference(pParser.mAccessorLibrary, pSrcController->mWeightInputJoints.mAccessor);
        if (&weightNamesAcc != &jointNamesAcc)
            throw DeadlyImportError("Temporary implementational laziness. If you read this, please report to the author.");
        // vertex weights
        const Collada::Accessor& weightsAcc = pParser.ResolveLibraryReference(pParser.mAccessorLibrary, pSrcController->mWeightInputWeights.mAccessor);
        const Collada::Data& weights = pParser.ResolveLibraryReference(pParser.mDataLibrary, weightsAcc.mSource);

        if (!jointNames.mIsStringArray || jointMatrices.mIsStringArray || weights.mIsStringArray)
            throw DeadlyImportError("Data type mismatch while resolving mesh joints");
        // sanity check: we rely on the vertex weights always coming as pairs of BoneIndex-WeightIndex
        if (pSrcController->mWeightInputJoints.mOffset != 0 || pSrcController->mWeightInputWeights.mOffset != 1)
            throw DeadlyImportError("Unsupported vertex_weight addressing scheme. ");

        // create containers to collect the weights for each bone
        size_t numBones = jointNames.mStrings.size();
        std::vector<std::vector<aiVertexWeight> > dstBones(numBones);

        // build a temporary array of pointers to the start of each vertex's weights
        typedef std::vector< std::pair<size_t, size_t> > IndexPairVector;
        std::vector<IndexPairVector::const_iterator> weightStartPerVertex;
        weightStartPerVertex.resize(pSrcController->mWeightCounts.size(), pSrcController->mWeights.end());

        IndexPairVector::const_iterator pit = pSrcController->mWeights.begin();
        for (size_t a = 0; a < pSrcController->mWeightCounts.size(); ++a) {
            weightStartPerVertex[a] = pit;
            pit += pSrcController->mWeightCounts[a];
        }

        // now for each vertex put the corresponding vertex weights into each bone's weight collection
        for (size_t a = pStartVertex; a < pStartVertex + numVertices; ++a) {
            // which position index was responsible for this vertex? that's also the index by which
            // the controller assigns the vertex weights
            size_t orgIndex = pSrcMesh->mFacePosIndices[a];
            // find the vertex weights for this vertex
            IndexPairVector::const_iterator iit = weightStartPerVertex[orgIndex];
            size_t pairCount = pSrcController->mWeightCounts[orgIndex];


            for( size_t b = 0; b < pairCount; ++b, ++iit) {
                const size_t jointIndex = iit->first;
                const size_t vertexIndex = iit->second;                
                ai_real weight = 1.0f;
                if (!weights.mValues.empty()) {
                    weight = ReadFloat(weightsAcc, weights, vertexIndex, 0);
                }

                // one day I gonna kill that XSI Collada exporter
                if (weight > 0.0f)
                {
                    aiVertexWeight w;
                    w.mVertexId = static_cast<unsigned int>(a - pStartVertex);
                    w.mWeight = weight;
                    dstBones[jointIndex].push_back(w);
                }
            }
        }

        // count the number of bones which influence vertices of the current submesh
        size_t numRemainingBones = 0;
        for( std::vector<std::vector<aiVertexWeight> >::const_iterator it = dstBones.begin(); it != dstBones.end(); ++it) {
            if( it->size() > 0) {
                ++numRemainingBones;
            }
        }

        // create bone array and copy bone weights one by one
        dstMesh->mNumBones = static_cast<unsigned int>(numRemainingBones);
        dstMesh->mBones = new aiBone*[numRemainingBones];
        size_t boneCount = 0;
        for( size_t a = 0; a < numBones; ++a) {
            // omit bones without weights
            if( dstBones[a].empty() ) {
                continue;
            }

            // create bone with its weights
            aiBone* bone = new aiBone;
            bone->mName = ReadString(jointNamesAcc, jointNames, a);
            bone->mOffsetMatrix.a1 = ReadFloat(jointMatrixAcc, jointMatrices, a, 0);
            bone->mOffsetMatrix.a2 = ReadFloat(jointMatrixAcc, jointMatrices, a, 1);
            bone->mOffsetMatrix.a3 = ReadFloat(jointMatrixAcc, jointMatrices, a, 2);
            bone->mOffsetMatrix.a4 = ReadFloat(jointMatrixAcc, jointMatrices, a, 3);
            bone->mOffsetMatrix.b1 = ReadFloat(jointMatrixAcc, jointMatrices, a, 4);
            bone->mOffsetMatrix.b2 = ReadFloat(jointMatrixAcc, jointMatrices, a, 5);
            bone->mOffsetMatrix.b3 = ReadFloat(jointMatrixAcc, jointMatrices, a, 6);
            bone->mOffsetMatrix.b4 = ReadFloat(jointMatrixAcc, jointMatrices, a, 7);
            bone->mOffsetMatrix.c1 = ReadFloat(jointMatrixAcc, jointMatrices, a, 8);
            bone->mOffsetMatrix.c2 = ReadFloat(jointMatrixAcc, jointMatrices, a, 9);
            bone->mOffsetMatrix.c3 = ReadFloat(jointMatrixAcc, jointMatrices, a, 10);
            bone->mOffsetMatrix.c4 = ReadFloat(jointMatrixAcc, jointMatrices, a, 11);
            bone->mNumWeights = static_cast<unsigned int>(dstBones[a].size());
            bone->mWeights = new aiVertexWeight[bone->mNumWeights];
            std::copy(dstBones[a].begin(), dstBones[a].end(), bone->mWeights);

            // apply bind shape matrix to offset matrix
            aiMatrix4x4 bindShapeMatrix;
            bindShapeMatrix.a1 = pSrcController->mBindShapeMatrix[0];
            bindShapeMatrix.a2 = pSrcController->mBindShapeMatrix[1];
            bindShapeMatrix.a3 = pSrcController->mBindShapeMatrix[2];
            bindShapeMatrix.a4 = pSrcController->mBindShapeMatrix[3];
            bindShapeMatrix.b1 = pSrcController->mBindShapeMatrix[4];
            bindShapeMatrix.b2 = pSrcController->mBindShapeMatrix[5];
            bindShapeMatrix.b3 = pSrcController->mBindShapeMatrix[6];
            bindShapeMatrix.b4 = pSrcController->mBindShapeMatrix[7];
            bindShapeMatrix.c1 = pSrcController->mBindShapeMatrix[8];
            bindShapeMatrix.c2 = pSrcController->mBindShapeMatrix[9];
            bindShapeMatrix.c3 = pSrcController->mBindShapeMatrix[10];
            bindShapeMatrix.c4 = pSrcController->mBindShapeMatrix[11];
            bindShapeMatrix.d1 = pSrcController->mBindShapeMatrix[12];
            bindShapeMatrix.d2 = pSrcController->mBindShapeMatrix[13];
            bindShapeMatrix.d3 = pSrcController->mBindShapeMatrix[14];
            bindShapeMatrix.d4 = pSrcController->mBindShapeMatrix[15];
            bone->mOffsetMatrix *= bindShapeMatrix;

            // HACK: (thom) Some exporters address the bone nodes by SID, others address them by ID or even name.
            // Therefore I added a little name replacement here: I search for the bone's node by either name, ID or SID,
            // and replace the bone's name by the node's name so that the user can use the standard
            // find-by-name method to associate nodes with bones.
            const Collada::Node* bnode = FindNode( pParser.mRootNode, bone->mName.data);
            if( !bnode) {
                bnode = FindNodeBySID( pParser.mRootNode, bone->mName.data);
            }

            // assign the name that we would have assigned for the source node
            if( bnode) {
                bone->mName.Set( FindNameForNode( bnode));
            } else {
                ASSIMP_LOG_WARN_F( "ColladaLoader::CreateMesh(): could not find corresponding node for joint \"", bone->mName.data, "\"." );
            }

            // and insert bone
            dstMesh->mBones[boneCount++] = bone;
        }
    }

    return dstMesh.release();
}